

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpztetrahedron.cpp
# Opt level: O3

void pztopology::TPZTetrahedron::ComputeHDivDirections<double>
               (TPZFMatrix<double> *gradx,TPZFMatrix<double> *directions)

{
  double *pdVar1;
  long lVar2;
  double dVar3;
  long lVar4;
  long lVar5;
  TPZManVector<double,_3> v1;
  TPZManVector<double,_3> v2;
  TPZManVector<double,_3> v3;
  TPZManVector<double,_3> local_d8;
  TPZManVector<double,_3> local_a0;
  TPZManVector<double,_3> local_68;
  
  dVar3 = TPZAxesTools<double>::ComputeDetjac(gradx);
  TPZManVector<double,_3>::TPZManVector(&local_d8,3);
  TPZManVector<double,_3>::TPZManVector(&local_a0,3);
  TPZManVector<double,_3>::TPZManVector(&local_68,3);
  lVar5 = (gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  lVar4 = 0;
  do {
    if ((lVar5 <= lVar4) || ((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1 = gradx->fElem;
    local_d8.super_TPZVec<double>.fStore[lVar4] = pdVar1[lVar4] * 6.0;
    if ((lVar5 <= lVar4) || ((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_a0.super_TPZVec<double>.fStore[lVar4] = pdVar1[lVar5 + lVar4] * 6.0;
    if ((lVar5 <= lVar4) || ((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_68.super_TPZVec<double>.fStore[lVar4] = pdVar1[lVar5 * 2 + lVar4] * 6.0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  lVar5 = 0;
  do {
    local_d8.super_TPZVec<double>.fStore[lVar5] =
         local_d8.super_TPZVec<double>.fStore[lVar5] / dVar3;
    local_a0.super_TPZVec<double>.fStore[lVar5] =
         local_a0.super_TPZVec<double>.fStore[lVar5] / dVar3;
    local_68.super_TPZVec<double>.fStore[lVar5] =
         local_68.super_TPZVec<double>.fStore[lVar5] / dVar3;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  lVar5 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  lVar4 = 0;
  while( true ) {
    if ((lVar5 <= lVar4) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1 = directions->fElem;
    pdVar1[lVar4] = -local_68.super_TPZVec<double>.fStore[lVar4];
    if ((lVar5 <= lVar4) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 + lVar4] =
         local_d8.super_TPZVec<double>.fStore[lVar4] - local_68.super_TPZVec<double>.fStore[lVar4];
    if ((lVar5 <= lVar4) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 2 + lVar4] =
         local_a0.super_TPZVec<double>.fStore[lVar4] - local_68.super_TPZVec<double>.fStore[lVar4];
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    if (lVar2 < 1 || lVar5 <= lVar4) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (lVar2 < 2 || lVar5 <= lVar4) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((lVar5 <= lVar4) || (lVar2 < 4)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 3 + lVar4] = (pdVar1[lVar4] + pdVar1[lVar5 + lVar4]) * 0.5;
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    if (lVar2 < 2 || lVar5 <= lVar4) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (lVar2 < 3 || lVar5 <= lVar4) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((lVar5 <= lVar4) || (lVar2 < 5)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 4 + lVar4] = (pdVar1[lVar5 + lVar4] + pdVar1[lVar5 * 2 + lVar4]) * 0.5;
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    if (lVar2 < 1 || lVar5 <= lVar4) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (lVar2 < 3 || lVar5 <= lVar4) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((lVar5 <= lVar4) || (lVar2 < 6)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 5 + lVar4] = (pdVar1[lVar4] + pdVar1[lVar5 * 2 + lVar4]) * 0.5;
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    if (lVar2 < 4 || lVar5 <= lVar4) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (lVar2 < 5 || lVar5 <= lVar4) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((lVar5 <= lVar4) || (lVar2 < 6)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((lVar5 <= lVar4) || (lVar2 < 7)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 6 + lVar4] =
         (pdVar1[lVar5 * 3 + lVar4] + pdVar1[lVar5 * 4 + lVar4] + pdVar1[lVar5 * 5 + lVar4]) / 3.0;
    if ((lVar5 <= lVar4) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 8)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 7 + lVar4] = -local_a0.super_TPZVec<double>.fStore[lVar4];
    if ((lVar5 <= lVar4) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 9)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 8 + lVar4] =
         local_d8.super_TPZVec<double>.fStore[lVar4] - local_a0.super_TPZVec<double>.fStore[lVar4];
    if ((lVar5 <= lVar4) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 10)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 9 + lVar4] =
         local_68.super_TPZVec<double>.fStore[lVar4] - local_a0.super_TPZVec<double>.fStore[lVar4];
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    if (lVar2 < 8 || lVar5 <= lVar4) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (lVar2 < 9 || lVar5 <= lVar4) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((lVar5 <= lVar4) || (lVar2 < 0xb)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 10 + lVar4] = (pdVar1[lVar5 * 7 + lVar4] + pdVar1[lVar5 * 8 + lVar4]) * 0.5;
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    if (lVar2 < 9 || lVar5 <= lVar4) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (lVar2 < 10 || lVar5 <= lVar4) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((lVar5 <= lVar4) || (lVar2 < 0xc)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 0xb + lVar4] = (pdVar1[lVar5 * 8 + lVar4] + pdVar1[lVar5 * 9 + lVar4]) * 0.5;
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    if (lVar2 < 8 || lVar5 <= lVar4) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (lVar2 < 10 || lVar5 <= lVar4) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((lVar5 <= lVar4) || (lVar2 < 0xd)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 0xc + lVar4] = (pdVar1[lVar5 * 7 + lVar4] + pdVar1[lVar5 * 9 + lVar4]) * 0.5;
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    if (lVar2 < 0xb || lVar5 <= lVar4) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (lVar2 < 0xc || lVar5 <= lVar4) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((lVar5 <= lVar4) || (lVar2 < 0xd)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((lVar5 <= lVar4) || (lVar2 < 0xe)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 0xd + lVar4] =
         (pdVar1[lVar5 * 10 + lVar4] + pdVar1[lVar5 * 0xb + lVar4] + pdVar1[lVar5 * 0xc + lVar4]) /
         3.0;
    if ((lVar5 <= lVar4) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xf))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 0xe + lVar4] = local_d8.super_TPZVec<double>.fStore[lVar4];
    if ((lVar5 <= lVar4) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x10))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 0xf + lVar4] = local_a0.super_TPZVec<double>.fStore[lVar4];
    if ((lVar5 <= lVar4) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x11))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 0x10 + lVar4] = local_68.super_TPZVec<double>.fStore[lVar4];
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    if (lVar2 < 0xf || lVar5 <= lVar4) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (lVar2 < 0x10 || lVar5 <= lVar4) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((lVar5 <= lVar4) || (lVar2 < 0x12)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 0x11 + lVar4] = (pdVar1[lVar5 * 0xe + lVar4] + pdVar1[lVar5 * 0xf + lVar4]) * 0.5
    ;
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    if (lVar2 < 0x10 || lVar5 <= lVar4) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (lVar2 < 0x11 || lVar5 <= lVar4) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((lVar5 <= lVar4) || (lVar2 < 0x13)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 0x12 + lVar4] =
         (pdVar1[lVar5 * 0xf + lVar4] + pdVar1[lVar5 * 0x10 + lVar4]) * 0.5;
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    if (lVar2 < 0xf || lVar5 <= lVar4) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (lVar2 < 0x11 || lVar5 <= lVar4) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((lVar5 <= lVar4) || (lVar2 < 0x14)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 0x13 + lVar4] =
         (pdVar1[lVar5 * 0xe + lVar4] + pdVar1[lVar5 * 0x10 + lVar4]) * 0.5;
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    if (lVar2 < 0x12 || lVar5 <= lVar4) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (lVar2 < 0x13 || lVar5 <= lVar4) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((lVar5 <= lVar4) || (lVar2 < 0x14)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((lVar5 <= lVar4) || (lVar2 < 0x15)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 0x14 + lVar4] =
         (pdVar1[lVar5 * 0x11 + lVar4] + pdVar1[lVar5 * 0x12 + lVar4] + pdVar1[lVar5 * 0x13 + lVar4]
         ) / 3.0;
    if ((lVar5 <= lVar4) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x16))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 0x15 + lVar4] = -local_d8.super_TPZVec<double>.fStore[lVar4];
    if ((lVar5 <= lVar4) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x17))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 0x16 + lVar4] =
         local_a0.super_TPZVec<double>.fStore[lVar4] - local_d8.super_TPZVec<double>.fStore[lVar4];
    if ((lVar5 <= lVar4) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x18))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 0x17 + lVar4] =
         local_68.super_TPZVec<double>.fStore[lVar4] - local_d8.super_TPZVec<double>.fStore[lVar4];
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    if (lVar2 < 0x16 || lVar5 <= lVar4) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (lVar2 < 0x17 || lVar5 <= lVar4) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((lVar5 <= lVar4) || (lVar2 < 0x19)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 0x18 + lVar4] =
         (pdVar1[lVar5 * 0x15 + lVar4] + pdVar1[lVar5 * 0x16 + lVar4]) * 0.5;
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    if (lVar2 < 0x17 || lVar5 <= lVar4) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (lVar2 < 0x18 || lVar5 <= lVar4) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((lVar5 <= lVar4) || (lVar2 < 0x1a)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 0x19 + lVar4] =
         (pdVar1[lVar5 * 0x16 + lVar4] + pdVar1[lVar5 * 0x17 + lVar4]) * 0.5;
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    if (lVar2 < 0x16 || lVar5 <= lVar4) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (lVar2 < 0x18 || lVar5 <= lVar4) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((lVar5 <= lVar4) || (lVar2 < 0x1b)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 0x1a + lVar4] =
         (pdVar1[lVar5 * 0x15 + lVar4] + pdVar1[lVar5 * 0x17 + lVar4]) * 0.5;
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    if (lVar2 < 0x19 || lVar5 <= lVar4) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (lVar2 < 0x1a || lVar5 <= lVar4) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((lVar5 <= lVar4) || (lVar2 < 0x1b)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((lVar5 <= lVar4) || (lVar2 < 0x1c)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 0x1b + lVar4] =
         (pdVar1[lVar5 * 0x18 + lVar4] + pdVar1[lVar5 * 0x19 + lVar4] + pdVar1[lVar5 * 0x1a + lVar4]
         ) / 3.0;
    if ((lVar5 <= lVar4) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x1d))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 0x1c + lVar4] = local_d8.super_TPZVec<double>.fStore[lVar4];
    if ((lVar5 <= lVar4) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x1e))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 0x1d + lVar4] =
         local_a0.super_TPZVec<double>.fStore[lVar4] - local_d8.super_TPZVec<double>.fStore[lVar4];
    if ((lVar5 <= lVar4) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x1f))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 0x1e + lVar4] = -local_a0.super_TPZVec<double>.fStore[lVar4];
    if ((lVar5 <= lVar4) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x20))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 0x1f + lVar4] = local_68.super_TPZVec<double>.fStore[lVar4];
    if ((lVar5 <= lVar4) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x21))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 0x20 + lVar4] =
         local_68.super_TPZVec<double>.fStore[lVar4] - local_d8.super_TPZVec<double>.fStore[lVar4];
    if ((lVar5 <= lVar4) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x22))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 0x21 + lVar4] =
         local_68.super_TPZVec<double>.fStore[lVar4] - local_a0.super_TPZVec<double>.fStore[lVar4];
    if ((lVar5 <= lVar4) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x23))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 0x22 + lVar4] = local_d8.super_TPZVec<double>.fStore[lVar4];
    if ((lVar5 <= lVar4) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x24))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 0x23 + lVar4] = local_a0.super_TPZVec<double>.fStore[lVar4];
    if ((lVar5 <= lVar4) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x25))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 0x24 + lVar4] = local_d8.super_TPZVec<double>.fStore[lVar4];
    if ((lVar5 <= lVar4) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x26))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 0x25 + lVar4] = local_68.super_TPZVec<double>.fStore[lVar4];
    if ((lVar5 <= lVar4) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x27))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 0x26 + lVar4] =
         local_a0.super_TPZVec<double>.fStore[lVar4] - local_d8.super_TPZVec<double>.fStore[lVar4];
    if ((lVar5 <= lVar4) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x28))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 0x27 + lVar4] =
         local_68.super_TPZVec<double>.fStore[lVar4] - local_d8.super_TPZVec<double>.fStore[lVar4];
    if ((lVar5 <= lVar4) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x29))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 0x28 + lVar4] = local_a0.super_TPZVec<double>.fStore[lVar4];
    if ((lVar5 <= lVar4) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x2a))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 0x29 + lVar4] = local_68.super_TPZVec<double>.fStore[lVar4];
    if ((lVar5 <= lVar4) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x2b))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 0x2a + lVar4] = local_d8.super_TPZVec<double>.fStore[lVar4];
    if ((lVar5 <= lVar4) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x2c))
    break;
    pdVar1[lVar5 * 0x2b + lVar4] = local_a0.super_TPZVec<double>.fStore[lVar4];
    if ((lVar5 <= lVar4) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x2d))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 0x2c + lVar4] = local_68.super_TPZVec<double>.fStore[lVar4];
    lVar4 = lVar4 + 1;
    if (lVar4 == 3) {
      TPZManVector<double,_3>::~TPZManVector(&local_68);
      TPZManVector<double,_3>::~TPZManVector(&local_a0);
      TPZManVector<double,_3>::~TPZManVector(&local_d8);
      return;
    }
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZTetrahedron::ComputeHDivDirections(TPZFMatrix<TVar> &gradx, TPZFMatrix<TVar> &directions)
    {
        TVar detjac = TPZAxesTools<TVar>::ComputeDetjac(gradx);
        
        TPZManVector<TVar,3> v1(3),v2(3),v3(3);
        
        for (int i=0; i<3; i++) {
            v1[i] = gradx(i,0)*6.;
            v2[i] = gradx(i,1)*6.;
            v3[i] = gradx(i,2)*6.;
        }
        
        
        /**
         * @file
         * @brief Computing mapped vector with scaling factor equal 1.0.
         * using contravariant piola mapping.
         */
        
        {
            // the above constants are wrong
            for (int i=0; i<3; i++) {
                v1[i] /= detjac;
                v2[i] /= detjac;
                v3[i] /= detjac;
            }
            for (int i=0; i<3; i++)
            {
                
                //face 0
                directions(i,0) = -v3[i];
                directions(i,1) = (v1[i]-v3[i]);
                directions(i,2) = (v2[i]-v3[i]);
                directions(i,3) = (directions(i,0)+directions(i,1))/2.;
                directions(i,4) = (directions(i,1)+directions(i,2))/2.;
                directions(i,5) = (directions(i,0)+directions(i,2))/2.;
                directions(i,6) = (directions(i,3)+directions(i,4)+directions(i,5))/3.;
                //face 1
                directions(i,7) = -v2[i];
                directions(i,8) = (v1[i]-v2[i]);
                directions(i,9) = (v3[i]-v2[i]);
                directions(i,10) = (directions(i,7)+directions(i,8))/2.;
                directions(i,11) = (directions(i,8)+directions(i,9))/2.;
                directions(i,12) = (directions(i,7)+directions(i,9))/2.;
                directions(i,13) = (directions(i,10)+directions(i,11)+directions(i,12))/3.;
                //face 2 face diagonal
                
                directions(i,14) = v1[i];
                directions(i,15) = v2[i];
                directions(i,16) = v3[i];
                directions(i,17) = (directions(i,14)+directions(i,15))/2.;
                directions(i,18) = (directions(i,15)+directions(i,16))/2.;
                directions(i,19) = (directions(i,14)+directions(i,16))/2.;
                directions(i,20) = (directions(i,17)+directions(i,18)+directions(i,19))/3.;
                //face 3
                directions(i,21) = -v1[i];
                directions(i,22) = (v2[i]-v1[i]);
                directions(i,23) = (v3[i]-v1[i]);
                directions(i,24) = (directions(i,21)+directions(i,22))/2.;
                directions(i,25) = (directions(i,22)+directions(i,23))/2.;
                directions(i,26) = (directions(i,21)+directions(i,23))/2.;
                directions(i,27) = (directions(i,24)+directions(i,25)+directions(i,26))/3.;
                
                //arestas
                directions(i,28) = v1[i];
                directions(i,29) = (v2[i]-v1[i]);
                directions(i,30) = -v2[i];
                directions(i,31) = v3[i];
                directions(i,32) = (v3[i]-v1[i]);
                directions(i,33) = (v3[i]-v2[i]);
                
                //faces
                directions(i,34) = v1[i];
                directions(i,35) = v2[i];
                directions(i,36) = v1[i];
                directions(i,37) = v3[i];
                directions(i,38) = (v2[i]-v1[i]);
                directions(i,39) = (v3[i]-v1[i]);//v3[i]-0.5*(v1[i]+v2[i]);//
                directions(i,40) = v2[i];
                directions(i,41) = v3[i];
                
                directions(i,42) = v1[i];
                directions(i,43) = v2[i];
                directions(i,44) = v3[i];
                
            }        

        } 

    }